

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.h
# Opt level: O1

void set_ref_ptrs(AV1_COMMON *cm,MACROBLOCKD *xd,MV_REFERENCE_FRAME ref0,MV_REFERENCE_FRAME ref1)

{
  scale_factors *psVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  
  iVar3 = -1;
  iVar4 = -1;
  if (ref0 < '\t') {
    bVar2 = 1;
    if ('\x01' < ref0) {
      bVar2 = ref0;
    }
    iVar4 = cm->remapped_ref_idx[bVar2 - 1];
  }
  psVar1 = (scale_factors *)0x0;
  if (iVar4 != -1) {
    psVar1 = cm->ref_scale_factors + iVar4;
  }
  xd->block_ref_scale_factors[0] = psVar1;
  if (ref1 < '\t') {
    bVar2 = 1;
    if ('\x01' < ref1) {
      bVar2 = ref1;
    }
    iVar3 = cm->remapped_ref_idx[bVar2 - 1];
  }
  psVar1 = (scale_factors *)0x0;
  if (iVar3 != -1) {
    psVar1 = cm->ref_scale_factors + iVar3;
  }
  xd->block_ref_scale_factors[1] = psVar1;
  return;
}

Assistant:

static inline void set_ref_ptrs(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                MV_REFERENCE_FRAME ref0,
                                MV_REFERENCE_FRAME ref1) {
  xd->block_ref_scale_factors[0] =
      get_ref_scale_factors_const(cm, ref0 >= LAST_FRAME ? ref0 : 1);
  xd->block_ref_scale_factors[1] =
      get_ref_scale_factors_const(cm, ref1 >= LAST_FRAME ? ref1 : 1);
}